

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::remaxCol(CLUFactorRational *this,int p_col,int len)

{
  int *piVar1;
  Dring *pDVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  CLUFactorRational *in_RDI;
  Dring *ring;
  int *idx;
  int k;
  int j;
  int i;
  int delta;
  int iVar4;
  CLUFactorRational *in_stack_ffffffffffffffd0;
  int local_1c;
  int local_18;
  int local_14;
  
  iVar4 = (int)((ulong)in_RDI >> 0x20);
  if ((Col *)(in_RDI->u).col.elem[in_ESI].next == &(in_RDI->u).col) {
    local_14 = in_EDX - (in_RDI->u).col.max[in_ESI];
    if ((in_RDI->u).col.size - (in_RDI->u).col.used < local_14) {
      packColumns(in_RDI);
      local_14 = in_EDX - (in_RDI->u).col.max[in_ESI];
      if ((double)(in_RDI->u).col.size <
          in_RDI->colMemMult * (double)(in_RDI->u).col.used + (double)in_EDX) {
        minColMem(in_stack_ffffffffffffffd0,iVar4);
      }
    }
    (in_RDI->u).col.used = local_14 + (in_RDI->u).col.used;
    (in_RDI->u).col.max[in_ESI] = in_EDX;
  }
  else {
    if (((in_RDI->u).col.size - (in_RDI->u).col.used < in_EDX) &&
       (packColumns(in_RDI),
       (double)(in_RDI->u).col.size <
       in_RDI->colMemMult * (double)(in_RDI->u).col.used + (double)in_EDX)) {
      minColMem(in_stack_ffffffffffffffd0,iVar4);
    }
    local_1c = (in_RDI->u).col.used;
    local_18 = (in_RDI->u).col.start[in_ESI];
    iVar3 = (in_RDI->u).col.len[in_ESI] + local_18;
    (in_RDI->u).col.start[in_ESI] = local_1c;
    (in_RDI->u).col.used = in_EDX + (in_RDI->u).col.used;
    piVar1 = (in_RDI->u).col.max;
    iVar4 = ((in_RDI->u).col.elem[in_ESI].prev)->idx;
    piVar1[iVar4] = (in_RDI->u).col.max[in_ESI] + piVar1[iVar4];
    (in_RDI->u).col.max[in_ESI] = in_EDX;
    ((in_RDI->u).col.elem[in_ESI].next)->prev = (in_RDI->u).col.elem[in_ESI].prev;
    ((in_RDI->u).col.elem[in_ESI].prev)->next = (in_RDI->u).col.elem[in_ESI].next;
    pDVar2 = (in_RDI->u).col.list.prev;
    (in_RDI->u).col.elem[in_ESI].next = pDVar2->next;
    ((in_RDI->u).col.elem[in_ESI].next)->prev = (in_RDI->u).col.elem + in_ESI;
    (in_RDI->u).col.elem[in_ESI].prev = pDVar2;
    pDVar2->next = (in_RDI->u).col.elem + in_ESI;
    piVar1 = (in_RDI->u).col.idx;
    for (; local_18 < iVar3; local_18 = local_18 + 1) {
      piVar1[local_1c] = piVar1[local_18];
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}